

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O2

ON_Quaternion *
ON_QuaternionProduct(ON_Quaternion *__return_storage_ptr__,ON_Quaternion *p,ON_Quaternion *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = p->a;
  dVar2 = p->b;
  dVar3 = q->a;
  dVar4 = q->b;
  dVar5 = p->c;
  dVar6 = p->d;
  dVar7 = q->c;
  dVar8 = q->d;
  ON_Quaternion::ON_Quaternion
            (__return_storage_ptr__,
             ((dVar1 * dVar3 - dVar4 * dVar2) - dVar5 * dVar7) - dVar6 * dVar8,
             (dVar5 * dVar8 + dVar1 * dVar4 + dVar3 * dVar2) - dVar6 * dVar7,
             dVar6 * dVar4 + dVar5 * dVar3 + (dVar1 * dVar7 - dVar8 * dVar2),
             dVar6 * dVar3 + ((dVar1 * dVar8 + dVar2 * dVar7) - dVar5 * dVar4));
  return __return_storage_ptr__;
}

Assistant:

ON_Quaternion ON_QuaternionProduct( const ON_Quaternion& p, const ON_Quaternion& q)
{
  return ON_Quaternion( p.a*q.a - p.b*q.b - p.c*q.c - p.d*q.d,
                        p.a*q.b + p.b*q.a + p.c*q.d - p.d*q.c,
                        p.a*q.c - p.b*q.d + p.c*q.a + p.d*q.b,
                        p.a*q.d + p.b*q.c - p.c*q.b + p.d*q.a);
}